

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LanguageDialect.cpp
# Opt level: O2

string * __thiscall psy::C::to_string_abi_cxx11_(string *__return_storage_ptr__,C *this,Std std)

{
  ostream *poVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    __s = "c89";
    __a = &local_11;
    break;
  case 1:
    __s = "c99";
    __a = &local_12;
    break;
  case 2:
    __s = "c11";
    __a = &local_13;
    break;
  case 3:
    __s = "c17";
    __a = &local_14;
    break;
  default:
    poVar1 = ::std::operator<<((ostream *)&::std::cout,"[ASSERT] at ");
    poVar1 = ::std::operator<<(poVar1,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/LanguageDialect.cpp"
                              );
    poVar1 = ::std::operator<<(poVar1,":");
    poVar1 = (ostream *)::std::ostream::operator<<((ostream *)poVar1,0x4f);
    poVar1 = ::std::operator<<(poVar1," ");
    __s = "";
    poVar1 = ::std::operator<<(poVar1,"");
    ::std::endl<char,std::char_traits<char>>(poVar1);
    __a = &local_15;
  }
  ::std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(LanguageDialect::Std std)
{
    switch (std) {
        case LanguageDialect::Std::C89_90:
            return "c89";

        case LanguageDialect::Std::C99:
            return "c99";

        case LanguageDialect::Std::C11:
            return "c11";

        case LanguageDialect::Std::C17_18:
            return "c17";

        default:
            PSY_ASSERT_3(false, return "", "");
    }
}